

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  bool bVar1;
  uint32_t uVar2;
  Reader local_148;
  Reader local_118;
  Reader local_e8;
  Reader local_b8;
  Reader local_78;
  ArrayPtr<const_char> local_48;
  undefined1 local_31;
  anon_union_8_2_6a1c0e2c_for_MemberInfo_21 aStack_30;
  bool isInUnion_local;
  StructOrGroup *fieldScope_local;
  Reader *decl_local;
  MemberInfo *pMStack_18;
  uint codeOrder_local;
  MemberInfo *parent_local;
  MemberInfo *this_local;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  local_31 = isInUnion;
  aStack_30 = (anon_union_8_2_6a1c0e2c_for_MemberInfo_21)fieldScope;
  fieldScope_local = (StructOrGroup *)decl;
  decl_local._4_4_ = codeOrder;
  pMStack_18 = parent;
  parent_local = this;
  Declaration::Param::Reader::getName(&local_78,decl);
  local_48 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_78);
  (this->name).content.ptr = local_48.ptr;
  (this->name).content.size_ = local_48.size_;
  Declaration::Id::Reader::Reader(&this->declId);
  this->declKind = FIELD;
  this->isParam = true;
  this->hasDefaultValue = false;
  Expression::Reader::Reader(&this->fieldType);
  Expression::Reader::Reader(&this->fieldDefaultValue);
  Declaration::Param::Reader::getAnnotations(&this->declAnnotations,(Reader *)fieldScope_local);
  uVar2 = Declaration::Param::Reader::getStartByte((Reader *)fieldScope_local);
  this->startByte = uVar2;
  uVar2 = Declaration::Param::Reader::getEndByte((Reader *)fieldScope_local);
  this->endByte = uVar2;
  kj::Maybe<capnp::Text::Reader>::Maybe(&this->docComment,(void *)0x0);
  kj::Maybe<capnp::schema::Field::Builder>::Maybe(&this->schema);
  capnp::schema::Node::Builder::Builder(&this->node,(void *)0x0);
  capnp::schema::Node::SourceInfo::Builder::Builder(&this->sourceInfo,(void *)0x0);
  this->field_21 = aStack_30;
  Declaration::Param::Reader::getType(&local_b8,(Reader *)fieldScope_local);
  (this->fieldType)._reader.dataSize = local_b8._reader.dataSize;
  (this->fieldType)._reader.pointerCount = local_b8._reader.pointerCount;
  *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_b8._reader._38_2_;
  (this->fieldType)._reader.nestingLimit = local_b8._reader.nestingLimit;
  *(undefined4 *)&(this->fieldType)._reader.field_0x2c = local_b8._reader._44_4_;
  (this->fieldType)._reader.data = local_b8._reader.data;
  (this->fieldType)._reader.pointers = local_b8._reader.pointers;
  (this->fieldType)._reader.segment = local_b8._reader.segment;
  (this->fieldType)._reader.capTable = local_b8._reader.capTable;
  Declaration::Param::Reader::getDefaultValue(&local_e8,(Reader *)fieldScope_local);
  bVar1 = Declaration::Param::DefaultValue::Reader::isValue(&local_e8);
  if (bVar1) {
    this->hasDefaultValue = true;
    Declaration::Param::Reader::getDefaultValue(&local_148,(Reader *)fieldScope_local);
    Declaration::Param::DefaultValue::Reader::getValue(&local_118,&local_148);
    memcpy(&this->fieldDefaultValue,&local_118,0x30);
  }
  return;
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Param::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declKind(Declaration::FIELD), isParam(true),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      fieldType = decl.getType();
      if (decl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = decl.getDefaultValue().getValue();
      }
    }